

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDAGetQuadSensNumRhsEvals(void *ida_mem,long *nrhsQSevals)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x6fc;
  }
  else {
    if (*(int *)((long)ida_mem + 0x110) != 0) {
      *nrhsQSevals = *(long *)((long)ida_mem + 0x5d8);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis for quadrature variables was not activated.";
    error_code = -0x32;
    line = 0x704;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetQuadSensNumRhsEvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAGetQuadSensNumRhsEvals(void* ida_mem, long int* nrhsQSevals)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadr_sensi == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    return (IDA_NO_QUADSENS);
  }

  *nrhsQSevals = IDA_mem->ida_nrQSe;

  return (IDA_SUCCESS);
}